

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# criticalsection.cc
# Opt level: O1

void __thiscall rtc::GlobalLockPod::Unlock(GlobalLockPod *this)

{
  string *result;
  bool bVar1;
  int local_184;
  FatalMessage local_180;
  
  result = (string *)0x0;
  LOCK();
  local_184 = this->lock_acquired;
  bVar1 = local_184 == 1;
  if (bVar1) {
    this->lock_acquired = 0;
    local_184 = 1;
  }
  UNLOCK();
  local_180.stream_ = (ostringstream)0x1;
  local_180._1_3_ = 0;
  if (!bVar1) {
    result = MakeCheckOpString<int,int>((int *)&local_180,&local_184,"1 == old_value");
  }
  if (result != (string *)0x0) {
    FatalMessage::FatalMessage
              (&local_180,
               "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/base/criticalsection.cc"
               ,0xe8,result);
    std::operator<<((ostream *)&local_180,"Unlock called without calling Lock first");
    FatalMessage::~FatalMessage(&local_180);
  }
  return;
}

Assistant:

void GlobalLockPod::Unlock() {
  int old_value = AtomicOps::CompareAndSwap(&lock_acquired, 1, 0);
  RTC_DCHECK_EQ(1, old_value) << "Unlock called without calling Lock first";
}